

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cscope.c
# Opt level: O2

int csexists(char *cmd)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char local_448 [8];
  char fname [1024];
  char *local_40;
  char *path;
  
  pcVar3 = strchr(cmd,0x2f);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getenv("PATH");
    if (pcVar3 == (char *)0x0) {
LAB_0011b6c9:
      uVar2 = 0;
    }
    else {
      local_40 = strndup(pcVar3,0x400);
      if (local_40 == (char *)0x0) {
        iVar1 = dobeep_msg("out of memory");
        return iVar1;
      }
      path = local_40;
      do {
        do {
          pcVar3 = strsep(&local_40,":");
          if (pcVar3 == (char *)0x0) {
LAB_0011b6c0:
            free(path);
            goto LAB_0011b6c9;
          }
        } while (*pcVar3 == '\0');
        uVar4 = strlen(pcVar3);
        while ((0 < (int)uVar4 && (pcVar3[(uVar4 & 0xffffffff) - 1] == '/'))) {
          uVar4 = (ulong)((int)uVar4 - 1);
          pcVar3[uVar4] = '\0';
        }
        uVar2 = snprintf(local_448,0x400,"%s/%s",pcVar3,cmd);
        if (0x3ff < uVar2) {
          dobeep_msg("path too long");
          goto LAB_0011b6c0;
        }
        iVar1 = access(local_448,0);
      } while (iVar1 != 0);
      free(path);
      uVar2 = 1;
    }
  }
  else {
    iVar1 = access(cmd,0);
    uVar2 = (uint)(iVar1 != -1);
  }
  return uVar2;
}

Assistant:

int
csexists(const char *cmd)
{
	char fname[NFILEN], *dir, *path, *pathc, *tmp;
	int  len, dlen;

	/* Special case if prog contains '/' */
	if (strchr(cmd, '/')) {
		if (access(cmd, F_OK) == -1)
			return (FALSE);
		else
			return (TRUE);
	}
	if ((tmp = getenv("PATH")) == NULL)
		return (FALSE);
	if ((pathc = path = strndup(tmp, NFILEN)) == NULL)
		return(dobeep_msg("out of memory"));

	while ((dir = strsep(&path, ":")) != NULL) {
		if (*dir == '\0')
			continue;

		dlen = strlen(dir);
		while (dlen > 0 && dir[dlen-1] == '/')
			dir[--dlen] = '\0';     /* strip trailing '/' */

		len = snprintf(fname, sizeof(fname), "%s/%s", dir, cmd);
		if (len < 0 || len >= sizeof(fname)) {
			(void)dobeep_msg("path too long");
			goto cleanup;
		}
		if(access(fname, F_OK) == 0) {
			free(pathc);
			return (TRUE);
		}
	}
cleanup:
	free(pathc);
	return (FALSE);
}